

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSerializerTest.cpp
# Opt level: O3

int main(int argC,char **argV)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  XSerializerHandlers *this;
  MemoryManager *pMVar4;
  XMLGrammarPoolImpl *pXVar5;
  SAX2XMLReader *pSVar6;
  BinMemInputStream *this_00;
  uchar *puVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  BinMemOutputStream *pBVar12;
  ulong uVar13;
  ifstream fin;
  char fURI [1000];
  undefined1 auStack_668 [16];
  MemoryManager *local_658;
  BinMemOutputStream *local_650;
  char **local_648;
  BinMemInputStream *local_640;
  ulong local_638;
  _func_int **local_630;
  long local_620 [4];
  byte abStack_600 [488];
  char local_418 [1000];
  
  local_648 = argV;
  if (1 < argC) {
    local_638 = (ulong)(uint)argC;
    localeStr[0x30] = '\0';
    localeStr[0x31] = '\0';
    localeStr[0x32] = '\0';
    localeStr[0x33] = '\0';
    localeStr[0x34] = '\0';
    localeStr[0x35] = '\0';
    localeStr[0x36] = '\0';
    localeStr[0x37] = '\0';
    localeStr[0x38] = '\0';
    localeStr[0x39] = '\0';
    localeStr[0x3a] = '\0';
    localeStr[0x3b] = '\0';
    localeStr[0x3c] = '\0';
    localeStr[0x3d] = '\0';
    localeStr[0x3e] = '\0';
    localeStr[0x3f] = '\0';
    localeStr[0x20] = '\0';
    localeStr[0x21] = '\0';
    localeStr[0x22] = '\0';
    localeStr[0x23] = '\0';
    localeStr[0x24] = '\0';
    localeStr[0x25] = '\0';
    localeStr[0x26] = '\0';
    localeStr[0x27] = '\0';
    localeStr[0x28] = '\0';
    localeStr[0x29] = '\0';
    localeStr[0x2a] = '\0';
    localeStr[0x2b] = '\0';
    localeStr[0x2c] = '\0';
    localeStr[0x2d] = '\0';
    localeStr[0x2e] = '\0';
    localeStr[0x2f] = '\0';
    localeStr[0x10] = '\0';
    localeStr[0x11] = '\0';
    localeStr[0x12] = '\0';
    localeStr[0x13] = '\0';
    localeStr[0x14] = '\0';
    localeStr[0x15] = '\0';
    localeStr[0x16] = '\0';
    localeStr[0x17] = '\0';
    localeStr[0x18] = '\0';
    localeStr[0x19] = '\0';
    localeStr[0x1a] = '\0';
    localeStr[0x1b] = '\0';
    localeStr[0x1c] = '\0';
    localeStr[0x1d] = '\0';
    localeStr[0x1e] = '\0';
    localeStr[0x1f] = '\0';
    localeStr[0] = '\0';
    localeStr[1] = '\0';
    localeStr[2] = '\0';
    localeStr[3] = '\0';
    localeStr[4] = '\0';
    localeStr[5] = '\0';
    localeStr[6] = '\0';
    localeStr[7] = '\0';
    localeStr[8] = '\0';
    localeStr[9] = '\0';
    localeStr[10] = '\0';
    localeStr[0xb] = '\0';
    localeStr[0xc] = '\0';
    localeStr[0xd] = '\0';
    localeStr[0xe] = '\0';
    localeStr[0xf] = '\0';
    uVar13 = 1;
    pcVar9 = localeStr;
    do {
      pcVar10 = local_648[uVar13];
      if (*pcVar10 != '-') {
        if ((int)local_638 != (int)uVar13) {
          if (localeStr[0] == '\0') {
            pcVar9 = (char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale;
          }
          xercesc_4_0::XMLPlatformUtils::Initialize
                    (pcVar9,(char *)0x0,(PanicHandler *)0x0,(MemoryManager *)0x0);
          if (recognizeNEL == '\x01') {
            xercesc_4_0::XMLPlatformUtils::recognizeNEL
                      (true,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          }
          std::ifstream::ifstream(local_620);
          if (doList == '\x01') {
            std::ifstream::open((char *)local_620,(_Ios_Openmode)local_648[uVar13]);
          }
          if ((abStack_600[*(long *)(local_620[0] + -0x18)] & 5) == 0) {
            local_630 = (_func_int **)std::operator<<;
            goto LAB_00103ec6;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Cannot open the list file: ",0x1b);
          pcVar9 = local_648[uVar13];
          if (pcVar9 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1091d8);
          }
          else {
            sVar8 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar8);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
          std::ostream::put(-0x28);
          iVar2 = 2;
          std::ostream::flush();
          goto LAB_00104646;
        }
        break;
      }
      if ((pcVar10[1] == '?') && (pcVar10[2] == '\0')) {
        usage();
        return 2;
      }
      if (((pcVar10[1] == 'v') && (pcVar10[2] == '=')) ||
         ((pcVar10[1] == 'V' && (pcVar10[2] == '=')))) {
        pcVar10 = pcVar10 + 3;
        iVar2 = strcmp(pcVar10,"never");
        if (iVar2 == 0) {
          valScheme = Val_Never;
        }
        else {
          iVar2 = strcmp(pcVar10,"auto");
          if (iVar2 == 0) {
            valScheme = Val_Auto;
          }
          else {
            iVar2 = strcmp(pcVar10,"always");
            if (iVar2 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Unknown -v= value: ",0x13);
              sVar8 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,pcVar10,sVar8);
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
              std::ostream::put(-0x28);
              std::ostream::flush();
              return 2;
            }
            valScheme = Val_Always;
          }
        }
      }
      else if (((pcVar10[1] == 'n') && (pcVar10[2] == '\0')) ||
              ((pcVar10[1] == 'N' && (pcVar10[2] == '\0')))) {
        doNamespaces = 1;
      }
      else if (((pcVar10[1] == 's') && (pcVar10[2] == '\0')) ||
              ((pcVar10[1] == 'S' && (pcVar10[2] == '\0')))) {
        doSchema = 1;
      }
      else if (((pcVar10[1] == 'f') && (pcVar10[2] == '\0')) ||
              ((pcVar10[1] == 'F' && (pcVar10[2] == '\0')))) {
        schemaFullChecking = 1;
      }
      else if (((pcVar10[1] == 'l') && (pcVar10[2] == '\0')) ||
              ((pcVar10[1] == 'L' && (pcVar10[2] == '\0')))) {
        doList = '\x01';
      }
      else if (((pcVar10[1] == 'p') && (pcVar10[2] == '\0')) ||
              ((pcVar10[1] == 'P' && (pcVar10[2] == '\0')))) {
        namespacePrefixes = 1;
      }
      else {
        iVar2 = strcmp(pcVar10,"-special:nel");
        if (iVar2 == 0) {
          recognizeNEL = '\x01';
        }
        else {
          iVar2 = strncmp(pcVar10,"-locale=",8);
          if (iVar2 == 0) {
            strcpy(localeStr,pcVar10 + 8);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Unknown option \'",0x10);
            poVar3 = std::operator<<((ostream *)&std::cerr,local_648[uVar13]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\', ignoring it\n",0xf);
            std::endl<char,std::char_traits<char>>(poVar3);
          }
        }
      }
      uVar13 = uVar13 + 1;
    } while (local_638 != uVar13);
  }
  usage();
  return 1;
LAB_00103ec6:
  uVar11 = 0;
  memset(local_418,0,1000);
  if (doList == '\x01') {
    if ((abStack_600[*(long *)(local_620[0] + -0x18)] & 2) == 0) goto code_r0x00103efb;
    std::ifstream::close();
  }
  else {
    iVar2 = (int)uVar13;
    if (iVar2 < (int)local_638) {
      pcVar9 = local_648[iVar2];
      uVar13 = (ulong)(iVar2 + 1);
      goto LAB_00103fc1;
    }
  }
  goto LAB_00104637;
code_r0x00103efb:
  std::ios::widen((char)auStack_668 + (char)*(long *)(local_620[0] + -0x18) + 'H');
  std::istream::getline((char *)local_620,(long)local_418,-0x18);
  if (local_418[0] != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"==Parsing== ",0xc);
    sVar8 = strlen(local_418);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_418,sVar8);
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    uVar11 = (ulong)(uint)(int)cVar1;
    std::ostream::put(-0x28);
    std::ostream::flush();
    pcVar9 = local_418;
LAB_00103fc1:
    if (handler == (XSerializerHandlers *)0x0) {
      this = (XSerializerHandlers *)operator_new(0x58);
      XSerializerHandlers::XSerializerHandlers(this);
      handler = this;
    }
    local_650 = (BinMemOutputStream *)xercesc_4_0::XMemory::operator_new((XMemory *)0x28,uVar11);
    uVar11 = 0x400;
    xercesc_4_0::BinMemOutputStream::BinMemOutputStream
              (local_650,0x400,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pMVar4 = (MemoryManager *)operator_new(8);
    pMVar4->_vptr_MemoryManager = local_630;
    pXVar5 = (XMLGrammarPoolImpl *)xercesc_4_0::XMemory::operator_new((XMemory *)0x40,uVar11);
    xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl(pXVar5,pMVar4);
    pSVar6 = getParser((XMLGrammarPool *)pXVar5,false);
    (*pSVar6->_vptr_SAX2XMLReader[0xc])
              (pSVar6,&xercesc_4_0::XMLUni::fgXercesCacheGrammarFromParse,1);
    (*pSVar6->_vptr_SAX2XMLReader[0x10])(pSVar6,pcVar9);
    pBVar12 = local_650;
    (**(code **)(*(long *)pXVar5 + 0x78))(pXVar5);
    (*pSVar6->_vptr_SAX2XMLReader[1])(pSVar6);
    (**(code **)(*(long *)pXVar5 + 8))(pXVar5);
    (*pMVar4->_vptr_MemoryManager[1])(pMVar4);
    this_00 = (BinMemInputStream *)
              xercesc_4_0::XMemory::operator_new((XMemory *)0x30,(ulong)pBVar12);
    puVar7 = (uchar *)xercesc_4_0::BinMemOutputStream::getRawBuffer();
    uVar11 = xercesc_4_0::BinMemOutputStream::getSize();
    xercesc_4_0::BinMemInputStream::BinMemInputStream
              (this_00,puVar7,uVar11,BufOpt_Reference,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
              );
    local_640 = this_00;
    local_658 = (MemoryManager *)operator_new(8);
    local_658->_vptr_MemoryManager = local_630;
    pXVar5 = (XMLGrammarPoolImpl *)xercesc_4_0::XMemory::operator_new((XMemory *)0x40,(ulong)puVar7)
    ;
    xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl(pXVar5,local_658);
    (**(code **)(*(long *)pXVar5 + 0x80))(pXVar5,local_640);
    pSVar6 = getParser((XMLGrammarPool *)pXVar5,true);
    (*pSVar6->_vptr_SAX2XMLReader[0xc])
              (pSVar6,&xercesc_4_0::XMLUni::fgXercesUseCachedGrammarInParse,1);
    (*(handler->super_DefaultHandler).super_EntityResolver._vptr_EntityResolver[0x12])();
    xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    (*pSVar6->_vptr_SAX2XMLReader[0x10])(pSVar6);
    xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    if (handler->fSawErrors == false) {
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1090b0);
      }
      else {
        sVar8 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ms (",5);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," elems, ",8);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," attrs, ",8);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," spaces, ",9);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," chars)",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    else {
      errorOccurred = 1;
    }
    (*pSVar6->_vptr_SAX2XMLReader[1])(pSVar6);
    (**(code **)(*(long *)pXVar5 + 8))(pXVar5);
    (*local_658->_vptr_MemoryManager[1])();
    (**(code **)(*(long *)local_640 + 8))();
    (**(code **)(*(long *)local_650 + 8))();
  }
  goto LAB_00103ec6;
LAB_00104637:
  xercesc_4_0::XMLPlatformUtils::Terminate();
  iVar2 = (uint)errorOccurred << 2;
LAB_00104646:
  std::ifstream::~ifstream(local_620);
  return iVar2;
}

Assistant:

int main(int argC, char* argV[])
{

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    memset(localeStr, 0, sizeof localeStr);

    int argInd;
    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            return 2;
        }
         else if (!strncmp(argV[argInd], "-v=", 3)
              ||  !strncmp(argV[argInd], "-V=", 3))
        {
            const char* const parm = &argV[argInd][3];

            if (!strcmp(parm, "never"))
                valScheme = SAX2XMLReader::Val_Never;
            else if (!strcmp(parm, "auto"))
                valScheme = SAX2XMLReader::Val_Auto;
            else if (!strcmp(parm, "always"))
                valScheme = SAX2XMLReader::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                return 2;
            }
        }
         else if (!strcmp(argV[argInd], "-n")
              ||  !strcmp(argV[argInd], "-N"))
        {
            doNamespaces = false;
        }
         else if (!strcmp(argV[argInd], "-s")
              ||  !strcmp(argV[argInd], "-S"))
        {
            doSchema = false;
        }
         else if (!strcmp(argV[argInd], "-f")
              ||  !strcmp(argV[argInd], "-F"))
        {
            schemaFullChecking = true;
        }
         else if (!strcmp(argV[argInd], "-l")
              ||  !strcmp(argV[argInd], "-L"))
        {
            doList = true;
        }
         else if (!strcmp(argV[argInd], "-p")
              ||  !strcmp(argV[argInd], "-P"))
        {
            namespacePrefixes = true;
        }
         else if (!strcmp(argV[argInd], "-special:nel"))
        {
            // turning this on will lead to non-standard compliance behaviour
            // it will recognize the unicode character 0x85 as new line character
            // instead of regular character as specified in XML 1.0
            // do not turn this on unless really necessary
             recognizeNEL = true;
        }
         else if (!strncmp(argV[argInd], "-locale=", 8))
        {
             // Get out the end of line
             strcpy(localeStr, &(argV[argInd][8]));
        }
        else
        {
            std::cerr << "Unknown option '" << argV[argInd]
                << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  There should at least one parameter left, and that
    //  should be the file name(s).
    //
    if (argInd == argC)
    {
        usage();
        return 1;
    }

    // Initialize the XML4C2 system
    try
    {
        if (strlen(localeStr))
        {
            XMLPlatformUtils::Initialize(localeStr);
        }
        else
        {
            XMLPlatformUtils::Initialize();
        }

        if (recognizeNEL)
        {
            XMLPlatformUtils::recognizeNEL(recognizeNEL);
        }

    }

    catch (const XMLException& toCatch)
    {
        std::cerr << "Error during initialization! Message:\n"
            << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    std::ifstream fin;

    // the input is a list file
    if (doList)
        fin.open(argV[argInd]);

    if (fin.fail()) {
        std::cerr <<"Cannot open the list file: " << argV[argInd] << std::endl;
        return 2;
    }

    while (true)
    {
        char fURI[1000];
        //initialize the array to zeros
        memset(fURI,0,sizeof(fURI));

        if (doList) {
            if (! fin.eof() ) {
                fin.getline (fURI, sizeof(fURI));
                if (!*fURI)
                    continue;
                else {
                    xmlFile = fURI;
                    std::cerr << "==Parsing== " << xmlFile << std::endl;
                }
            }
            else
                break;
        }
        else {
            if (argInd < argC)
            {
                 xmlFile = argV[argInd];
                 argInd++;
            }
            else
                break;
        }

        parseCase(xmlFile);
    }

    if (doList)
        fin.close();

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorOccurred)
        return 4;
    else
        return 0;

}